

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * __thiscall cmFileAPI::BuildCMake(Value *__return_storage_ptr__,cmFileAPI *this)

{
  Value *pVVar1;
  string *psVar2;
  Value *pVVar3;
  Value local_130;
  Value local_108;
  Value local_e0;
  Value local_b8;
  Value local_90;
  Value local_68;
  Value local_40;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  cmake::ReportVersionJson(&local_40,this->CMakeInstance);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  Json::Value::Value(&local_68,objectValue);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"paths");
  pVVar1 = Json::Value::operator=(pVVar1,&local_68);
  Json::Value::~Value(&local_68);
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  Json::Value::Value(&local_90,psVar2);
  pVVar3 = Json::Value::operator[](pVVar1,"cmake");
  Json::Value::operator=(pVVar3,&local_90);
  Json::Value::~Value(&local_90);
  psVar2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  Json::Value::Value(&local_b8,psVar2);
  pVVar3 = Json::Value::operator[](pVVar1,"ctest");
  Json::Value::operator=(pVVar3,&local_b8);
  Json::Value::~Value(&local_b8);
  psVar2 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  Json::Value::Value(&local_e0,psVar2);
  pVVar3 = Json::Value::operator[](pVVar1,"cpack");
  Json::Value::operator=(pVVar3,&local_e0);
  Json::Value::~Value(&local_e0);
  psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  Json::Value::Value(&local_108,psVar2);
  pVVar1 = Json::Value::operator[](pVVar1,"root");
  Json::Value::operator=(pVVar1,&local_108);
  Json::Value::~Value(&local_108);
  (*this->CMakeInstance->GlobalGenerator->_vptr_cmGlobalGenerator[6])(&local_130);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"generator");
  Json::Value::operator=(pVVar1,&local_130);
  Json::Value::~Value(&local_130);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCMake()
{
  Json::Value cmake = Json::objectValue;
  cmake["version"] = this->CMakeInstance->ReportVersionJson();
  Json::Value& cmake_paths = cmake["paths"] = Json::objectValue;
  cmake_paths["cmake"] = cmSystemTools::GetCMakeCommand();
  cmake_paths["ctest"] = cmSystemTools::GetCTestCommand();
  cmake_paths["cpack"] = cmSystemTools::GetCPackCommand();
  cmake_paths["root"] = cmSystemTools::GetCMakeRoot();
  cmake["generator"] = this->CMakeInstance->GetGlobalGenerator()->GetJson();
  return cmake;
}